

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O0

Reader * __thiscall
capnp::TwoPartyVatNetwork::getPeerVatId(Reader *__return_storage_ptr__,TwoPartyVatNetwork *this)

{
  Builder local_38;
  TwoPartyVatNetwork *local_10;
  TwoPartyVatNetwork *this_local;
  
  local_10 = this;
  MessageBuilder::getRoot<capnp::rpc::twoparty::VatId>
            (&local_38,&(this->peerVatId).super_MessageBuilder);
  rpc::twoparty::VatId::Builder::operator_cast_to_Reader(__return_storage_ptr__,&local_38);
  return __return_storage_ptr__;
}

Assistant:

rpc::twoparty::VatId::Reader TwoPartyVatNetwork::getPeerVatId() {
  return peerVatId.getRoot<rpc::twoparty::VatId>();
}